

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser.cpp
# Opt level: O0

bool __thiscall QHttpHeaderParser::parseStatus(QHttpHeaderParser *this,QByteArrayView status)

{
  QByteArrayView other;
  bool bVar1;
  char cVar2;
  int iVar3;
  qsizetype qVar4;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  qsizetype j;
  int i;
  bool ok;
  QByteArrayView code;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 in_stack_ffffffffffffff78 [16];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar5;
  QByteArrayView *pQVar6;
  bool local_59;
  undefined1 local_58 [31];
  byte local_39;
  QByteArrayView local_38;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  qVar4 = QByteArrayView::size(&local_18);
  if (10 < qVar4) {
    QByteArrayView::QByteArrayView<6ul>
              (in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_);
    other.m_size._4_4_ = in_stack_ffffffffffffff94;
    other.m_size._0_4_ = in_stack_ffffffffffffff90;
    other.m_data = (storage_type *)pQVar6;
    bVar1 = QByteArrayView::startsWith
                      ((QByteArrayView *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT24(in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68))),other);
    if (((bVar1) &&
        (cVar2 = QByteArrayView::at(in_RDI,CONCAT17(in_stack_ffffffffffffff6f,
                                                    CONCAT16(in_stack_ffffffffffffff6e,
                                                             CONCAT24(in_stack_ffffffffffffff6c,
                                                                      in_stack_ffffffffffffff68)))),
        cVar2 == '.')) &&
       (cVar2 = QByteArrayView::at(in_RDI,CONCAT17(in_stack_ffffffffffffff6f,
                                                   CONCAT16(in_stack_ffffffffffffff6e,
                                                            CONCAT24(in_stack_ffffffffffffff6c,
                                                                     in_stack_ffffffffffffff68)))),
       cVar2 == ' ')) {
      cVar2 = QByteArrayView::at(in_RDI,CONCAT17(in_stack_ffffffffffffff6f,
                                                 CONCAT16(in_stack_ffffffffffffff6e,
                                                          CONCAT24(in_stack_ffffffffffffff6c,
                                                                   in_stack_ffffffffffffff68))));
      *(int *)((long)&in_RDI[2].m_size + 4) = cVar2 + -0x30;
      cVar2 = QByteArrayView::at(in_RDI,CONCAT17(in_stack_ffffffffffffff6f,
                                                 CONCAT16(in_stack_ffffffffffffff6e,
                                                          CONCAT24(in_stack_ffffffffffffff6c,
                                                                   in_stack_ffffffffffffff68))));
      *(int *)&in_RDI[2].m_data = cVar2 + -0x30;
      iVar5 = 8;
      qVar4 = QByteArrayView::indexOf
                        (in_stack_ffffffffffffff78._0_8_,(char)((ulong)in_RDI >> 0x38),
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT24(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68))));
      pQVar6 = in_stack_ffffffffffffff78._0_8_;
      local_38.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
      local_38.m_size = 0xaaaaaaaaaaaaaaaa;
      if (iVar5 < qVar4) {
        local_38 = QByteArrayView::sliced
                             (in_stack_ffffffffffffff78._8_8_,(qsizetype)pQVar6,(qsizetype)in_RDI);
      }
      else {
        local_38 = QByteArrayView::sliced
                             ((QByteArrayView *)CONCAT44(iVar5,in_stack_ffffffffffffff90),qVar4);
      }
      local_39 = 0;
      iVar3 = QByteArrayView::toInt
                        (pQVar6,(bool *)in_RDI,
                         CONCAT13(in_stack_ffffffffffffff6f,
                                  CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
      *(int *)&in_RDI[2].m_size = iVar3;
      if (iVar5 < qVar4) {
        QByteArrayView::sliced((QByteArrayView *)CONCAT44(iVar5,in_stack_ffffffffffffff90),qVar4);
        QString::fromLatin1((QByteArrayView *)local_58);
      }
      else {
        QString::QString((QString *)0x1e0d35);
      }
      QString::operator=((QString *)in_RDI,
                         (QString *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT24(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68))));
      QString::~QString((QString *)0x1e0d52);
      local_59 = false;
      if (((local_39 & 1) != 0) && (local_59 = false, *(uint *)((long)&in_RDI[2].m_size + 4) < 10))
      {
        local_59 = *(uint *)&in_RDI[2].m_data < 10;
      }
      goto LAB_001e0d8a;
    }
  }
  local_59 = false;
LAB_001e0d8a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_59;
}

Assistant:

bool QHttpHeaderParser::parseStatus(QByteArrayView status)
{
    // from RFC 2616:
    //        Status-Line = HTTP-Version SP Status-Code SP Reason-Phrase CRLF
    //        HTTP-Version   = "HTTP" "/" 1*DIGIT "." 1*DIGIT
    // that makes: 'HTTP/n.n xxx Message'
    // byte count:  0123456789012

    static const int minLength = 11;
    static const int dotPos = 6;
    static const int spacePos = 8;
    static const char httpMagic[] = "HTTP/";

    if (status.size() < minLength
        || !status.startsWith(httpMagic)
        || status.at(dotPos) != '.'
        || status.at(spacePos) != ' ') {
        // I don't know how to parse this status line
        return false;
    }

    // optimize for the valid case: defer checking until the end
    majorVersion = status.at(dotPos - 1) - '0';
    minorVersion = status.at(dotPos + 1) - '0';

    int i = spacePos;
    qsizetype j = status.indexOf(' ', i + 1);
    const QByteArrayView code = j > i ? status.sliced(i + 1, j - i - 1)
                                      : status.sliced(i + 1);

    bool ok = false;
    statusCode = code.toInt(&ok);

    reasonPhrase = j > i ? QString::fromLatin1(status.sliced(j + 1))
                         : QString();

    return ok && uint(majorVersion) <= 9 && uint(minorVersion) <= 9;
}